

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
          (QVLABase<QWidget_*> *this,qsizetype prealloc,void *array,QWidget **args)

{
  QVLABase<QWidget_*> *this_00;
  QVLABase<QWidget_*> *pQVar1;
  iterator ptr;
  QWidget **ppQVar2;
  QWidget **in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QWidget_*> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QWidget_*> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    QVLABase<QWidget_*>::growBy((QVLABase<QWidget_*> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = QVLABase<QWidget_*>::end(this_00);
  ppQVar2 = q20::construct_at<QWidget*,QWidget*const&,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return ppQVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }